

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

float __thiscall notch::core::HingeLoss::output(HingeLoss *this,Array *actual,Array *expected)

{
  float fVar1;
  
  if (actual->_M_size != 1) {
    __assert_fail("1 == actual.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x812,"virtual float notch::HingeLoss::output(const Array &, const Array &)");
  }
  if (expected->_M_size == 1) {
    fVar1 = *actual->_M_data * *expected->_M_data;
    if (1.0 <= fVar1) {
      *(this->lossGrad)._M_data = 0.0;
      fVar1 = 0.0;
    }
    else {
      *(this->lossGrad)._M_data = -*expected->_M_data;
      fVar1 = 1.0 - fVar1;
    }
    return fVar1;
  }
  __assert_fail("1 == expected.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x813,"virtual float notch::HingeLoss::output(const Array &, const Array &)");
}

Assistant:

virtual float output(const Array &actual, const Array &expected) {
        assert (1 == actual.size());
        assert (1 == expected.size());
        float loss;
        float p = actual[0]*expected[0];
        if (p >= 1.0) {
            lossGrad[0] = 0.0;
            loss = 0.0;
        } else {
            lossGrad[0] = - expected[0];
            loss = 1 - p;
        }
        return loss;
    }